

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_resolveImportsOfGrandchildUnits_Test::~Importer_resolveImportsOfGrandchildUnits_Test
          (Importer_resolveImportsOfGrandchildUnits_Test *this)

{
  Importer_resolveImportsOfGrandchildUnits_Test *this_local;
  
  ~Importer_resolveImportsOfGrandchildUnits_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, resolveImportsOfGrandchildUnits)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/nested_units.cellml"));
    auto importer = libcellml::Importer::create();

    EXPECT_TRUE(model->hasUnresolvedImports());
    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(1), importer->libraryCount());
    EXPECT_EQ(resourcePath("importer/source_units.cellml"), importer->key(0));
    EXPECT_FALSE(model->hasUnresolvedImports());
}